

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_scramble_stats(player *p)

{
  int16_t iVar1;
  int16_t iVar2;
  int16_t iVar3;
  short sVar4;
  uint32_t uVar5;
  wchar_t swap;
  wchar_t j;
  wchar_t i;
  wchar_t cur2;
  wchar_t max2;
  wchar_t cur1;
  wchar_t max1;
  player *p_local;
  
  swap = L'\x04';
  while( true ) {
    if (swap < L'\x01') {
      p->upkeep->update = p->upkeep->update | 1;
      return;
    }
    uVar5 = Rand_div(swap);
    iVar1 = p->stat_max[swap];
    iVar2 = p->stat_cur[swap];
    iVar3 = p->stat_cur[(int)uVar5];
    p->stat_max[swap] = p->stat_max[(int)uVar5];
    p->stat_cur[swap] = iVar3;
    p->stat_max[(int)uVar5] = iVar1;
    p->stat_cur[(int)uVar5] = iVar2;
    sVar4 = p->stat_map[swap];
    if ((sVar4 < 0) || (4 < sVar4)) break;
    p->stat_map[swap] = p->stat_map[(int)uVar5];
    if ((p->stat_map[swap] < 0) || (4 < p->stat_map[swap])) {
      __assert_fail("p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                    ,0x1f8,"void player_scramble_stats(struct player *)");
    }
    p->stat_map[(int)uVar5] = sVar4;
    swap = swap + L'\xffffffff';
  }
  __assert_fail("swap >= 0 && swap < STAT_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                ,0x1f6,"void player_scramble_stats(struct player *)");
}

Assistant:

void player_scramble_stats(struct player *p)
{
	int max1, cur1, max2, cur2, i, j, swap;

	/* Fisher-Yates shuffling algorithm */
	for (i = STAT_MAX - 1; i > 0; --i) {
		j = randint0(i);

		max1 = p->stat_max[i];
		cur1 = p->stat_cur[i];
		max2 = p->stat_max[j];
		cur2 = p->stat_cur[j];

		p->stat_max[i] = max2;
		p->stat_cur[i] = cur2;
		p->stat_max[j] = max1;
		p->stat_cur[j] = cur1;

		/* Record what we did */
		swap = p->stat_map[i];
		assert(swap >= 0 && swap < STAT_MAX);
		p->stat_map[i] = p->stat_map[j];
		assert(p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX);
		p->stat_map[j] = swap;
	}

	/* Mark what else needs to be updated */
	p->upkeep->update |= (PU_BONUS);
}